

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

void rf_draw_ray(rf_ray ray,rf_color color)

{
  rf_gfx_begin(RF_LINES);
  rf_gfx_color4ub(color.r,color.g,color.b,color.a);
  rf_gfx_color4ub(color.r,color.g,color.b,color.a);
  rf_gfx_vertex3f(ray.position.x,ray.position.y,ray.position.z);
  rf_gfx_vertex3f(ray.direction.x * 10000.0 + ray.position.x,
                  ray.direction.y * 10000.0 + ray.position.y,
                  ray.direction.z * 10000.0 + ray.position.z);
  rf_gfx_end();
  return;
}

Assistant:

RF_API void rf_draw_ray(rf_ray ray, rf_color color)
{
    float scale = 10000;

    rf_gfx_begin(RF_LINES);
    rf_gfx_color4ub(color.r, color.g, color.b, color.a);
    rf_gfx_color4ub(color.r, color.g, color.b, color.a);

    rf_gfx_vertex3f(ray.position.x, ray.position.y, ray.position.z);
    rf_gfx_vertex3f(ray.position.x + ray.direction.x*scale, ray.position.y + ray.direction.y*scale, ray.position.z + ray.direction.z*scale);
    rf_gfx_end();
}